

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O2

void __thiscall
QGraphicsAnchorLayoutPrivate::removeCenterAnchors
          (QGraphicsAnchorLayoutPrivate *this,QGraphicsLayoutItem *item,AnchorPoint centerEdge,
          bool substitute)

{
  QGraphicsLayoutItem *pQVar1;
  QGraphicsLayoutItem *item_00;
  bool bVar2;
  AnchorVertex *pAVar3;
  AnchorVertex *pAVar4;
  AnchorData *pAVar5;
  QSimplexConstraint *this_00;
  AnchorVertex *v2;
  AnchorPoint edge;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *this_01;
  long lVar6;
  QSimplexVariable *pQVar7;
  int i;
  uint uVar8;
  undefined1 *puVar9;
  long in_FS_OFFSET;
  AnchorPoint local_94;
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr;
  if (centerEdge == AnchorVerticalCenter) {
    local_94 = AnchorTop;
    lVar6 = 1;
    edge = AnchorBottom;
  }
  else {
    if (centerEdge != AnchorHorizontalCenter) goto LAB_0055d90c;
    lVar6 = 0;
    edge = AnchorRight;
    local_94 = AnchorLeft;
  }
  pAVar3 = internalVertex(this,item,centerEdge);
  if (pAVar3 != (AnchorVertex *)0x0) {
    pAVar4 = internalVertex(this,item,local_94);
    this_01 = (this->graph).m_data + lVar6;
    pAVar5 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
             edgeData(this_01,pAVar4,pAVar3);
    uVar8 = (uint)(this->itemCenterConstraints).m_data[lVar6].d.size;
    pQVar7 = &pAVar5->super_QSimplexVariable;
    if (pAVar5 == (AnchorData *)0x0) {
      pQVar7 = (QSimplexVariable *)0x0;
    }
    do {
      uVar8 = uVar8 - 1;
      if ((int)uVar8 < 0) goto LAB_0055d7a0;
      local_58.d = (Data *)pQVar7;
      bVar2 = QHash<QSimplexVariable_*,_double>::contains
                        (&(this->itemCenterConstraints).m_data[lVar6].d.ptr[uVar8 & 0x7fffffff]->
                          variables,(QSimplexVariable **)&local_58);
    } while (!bVar2);
    this_00 = QList<QSimplexConstraint_*>::takeAt
                        ((this->itemCenterConstraints).m_data + lVar6,(ulong)(uVar8 & 0x7fffffff));
    if (this_00 != (QSimplexConstraint *)0x0) {
      QHash<QSimplexVariable_*,_double>::~QHash(&this_00->variables);
    }
    operator_delete(this_00,0x30);
LAB_0055d7a0:
    if (substitute) {
      pAVar5 = (AnchorData *)operator_new(0x80);
      (pAVar5->super_QSimplexVariable).result = 0.0;
      (pAVar5->super_QSimplexVariable).index = 0;
      pAVar5->_vptr_AnchorData = (_func_int **)&PTR__AnchorData_007eb0a0;
      pAVar5->from = (AnchorVertex *)0x0;
      pAVar5->to = (AnchorVertex *)0x0;
      pAVar5->minSize = 0.0;
      pAVar5->prefSize = 0.0;
      pAVar5->maxSize = 0.0;
      pAVar5->minPrefSize = 0.0;
      pAVar5->maxPrefSize = 0.0;
      pAVar5->sizeAtMinimum = 0.0;
      pAVar5->sizeAtPreferred = 0.0;
      pAVar5->sizeAtMaximum = 0.0;
      pAVar5->item = (QGraphicsLayoutItem *)0x0;
      pAVar5->graphicsAnchor = (QGraphicsAnchor *)0x0;
      pAVar5->field_0x78 = 0;
      addAnchor_helper(this,item,local_94,item,edge,pAVar5);
      QtGraphicsAnchorLayout::AnchorData::refreshSizeHints(pAVar5,(QLayoutStyleInfo *)0x0);
      removeAnchor_helper(this,pAVar4,pAVar3);
      pAVar4 = internalVertex(this,item,edge);
      removeAnchor_helper(this,pAVar3,pAVar4);
    }
    else {
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (AnchorVertex **)&DAT_aaaaaaaaaaaaaaaa;
      Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
      adjacentVertices((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_58,this_01,pAVar3);
      for (puVar9 = (undefined1 *)0x0; puVar9 < (ulong)local_58.size; puVar9 = puVar9 + 1) {
        item_00 = local_58.ptr[(long)puVar9]->m_item;
        if (item_00 != item) {
          v2 = internalVertex(this,item_00,local_58.ptr[(long)puVar9]->m_edge);
          removeAnchor_helper(this,pAVar3,v2);
        }
      }
      pAVar3 = internalVertex(this,item,edge);
      removeAnchor_helper(this,pAVar4,pAVar3);
      QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::~QArrayDataPointer(&local_58);
    }
    if (pQVar1 == item) {
      (this->layoutCentralVertex).m_data[lVar6] = (AnchorVertex *)0x0;
    }
  }
LAB_0055d90c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorLayoutPrivate::removeCenterAnchors(
    QGraphicsLayoutItem *item, Qt::AnchorPoint centerEdge,
    bool substitute)
{
    Q_Q(QGraphicsAnchorLayout);

    Qt::Orientation orientation;
    switch (centerEdge) {
    case Qt::AnchorHorizontalCenter:
        orientation = Qt::Horizontal;
        break;
    case Qt::AnchorVerticalCenter:
        orientation = Qt::Vertical;
        break;
    default:
        // Don't remove edges that not the center ones
        return;
    }

    // Orientation code
    Qt::AnchorPoint firstEdge;
    Qt::AnchorPoint lastEdge;

    if (orientation == Qt::Horizontal) {
        firstEdge = Qt::AnchorLeft;
        lastEdge = Qt::AnchorRight;
    } else {
        firstEdge = Qt::AnchorTop;
        lastEdge = Qt::AnchorBottom;
    }

    AnchorVertex *center = internalVertex(item, centerEdge);
    if (!center)
        return;
    AnchorVertex *first = internalVertex(item, firstEdge);

    Q_ASSERT(first);
    Q_ASSERT(center);

    Graph<AnchorVertex, AnchorData> &g = graph[orientation];


    AnchorData *oldData = g.edgeData(first, center);
    // Remove center constraint
    for (int i = itemCenterConstraints[orientation].size() - 1; i >= 0; --i) {
        if (itemCenterConstraints[orientation].at(i)->variables.contains(oldData)) {
            delete itemCenterConstraints[orientation].takeAt(i);
            break;
        }
    }

    if (substitute) {
        // Create the new anchor that should substitute the left-center-right anchors.
        AnchorData *data = new AnchorData;
        addAnchor_helper(item, firstEdge, item, lastEdge, data);
        data->refreshSizeHints();

        // Remove old anchors
        removeAnchor_helper(first, center);
        removeAnchor_helper(center, internalVertex(item, lastEdge));

    } else {
        // this is only called from removeAnchors()
        // first, remove all non-internal anchors
        QList<AnchorVertex*> adjacents = g.adjacentVertices(center);
        for (int i = 0; i < adjacents.size(); ++i) {
            AnchorVertex *v = adjacents.at(i);
            if (v->m_item != item) {
                removeAnchor_helper(center, internalVertex(v->m_item, v->m_edge));
            }
        }
        // when all non-internal anchors is removed it will automatically merge the
        // center anchor into a left-right (or top-bottom) anchor. We must also delete that.
        // by this time, the center vertex is deleted and merged into a non-centered internal anchor
        removeAnchor_helper(first, internalVertex(item, lastEdge));
    }

    if (item == q) {
        layoutCentralVertex[orientation] = nullptr;
    }
}